

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O2

size_t __thiscall TxRequestTracker::Impl::Count(Impl *this,NodeId peer)

{
  const_iterator cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  NodeId local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = peer;
  cVar1 = std::
          unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
          ::find(&this->m_peerinfo,&local_10);
  if (cVar1.super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
      ._M_cur == (__node_type *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = *(size_t *)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false>
                    ._M_cur + 0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return sVar2;
  }
  __stack_chk_fail();
}

Assistant:

size_t Count(NodeId peer) const
    {
        auto it = m_peerinfo.find(peer);
        if (it != m_peerinfo.end()) return it->second.m_total;
        return 0;
    }